

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O3

optional<jbcoin::PublicKey> * __thiscall
jbcoin::get<jbcoin::PublicKey,jbcoin::STBlob>
          (optional<jbcoin::PublicKey> *__return_storage_ptr__,jbcoin *this,STObject *st,
          TypedField<jbcoin::STBlob> *f)

{
  int iVar1;
  STBase *pSVar2;
  long lVar3;
  Slice local_20;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  pSVar2 = STObject::peekAtPField((STObject *)this,(SField *)st);
  if (pSVar2 != (STBase *)0x0) {
    iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
    if (iVar1 != 0) {
      lVar3 = __dynamic_cast(pSVar2,&STBase::typeinfo,&STBlob::typeinfo,0);
      if (lVar3 == 0) {
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
      }
      local_20.data_ = *(uint8_t **)(lVar3 + 0x10);
      local_20.size_ = *(size_t *)(lVar3 + 0x18);
      PublicKey::PublicKey((PublicKey *)&(__return_storage_ptr__->super_type).m_storage,&local_20);
      (__return_storage_ptr__->super_type).m_initialized = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<T>
get (STObject const& st,
    TypedField<U> const& f)
{
    boost::optional<T> t;
    STBase const* const b =
        st.peekAtPField(f);
    if (! b)
        return t;
    auto const id = b->getSType();
    if (id == STI_NOTPRESENT)
        return t;
    auto const u =
        dynamic_cast<U const*>(b);
    // This should never happen
    if (! u)
        Throw<std::runtime_error> (
            "Wrong field type");
    STExchange<U, T>::get(t, *u);
    return t;
}